

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O0

void ncnn::pack_A_tile(Mat *A,Mat *AT,int batch,int max_ii,int max_kk)

{
  int iVar1;
  int local_bc;
  float *local_b8;
  int local_ac;
  float *local_a8;
  int local_9c;
  float *local_98;
  int local_8c;
  float *local_88;
  int kk_4;
  float *p0_4;
  int kk_3;
  float *p0_3;
  int kk_2;
  float *p0_2;
  int kk_1;
  float *p0_1;
  int kk;
  float *p0;
  int ii;
  float *pp;
  int b;
  int N;
  int max_kk_local;
  int max_ii_local;
  int batch_local;
  Mat *AT_local;
  
  iVar1 = max_kk * batch;
  for (kk_2 = 0; kk_2 < batch; kk_2 = kk_2 + 1) {
    p0_3 = (float *)((long)AT->data + (long)AT->w * (long)kk_2 * AT->elemsize);
    for (kk_3 = 0; kk_3 + 0xf < max_ii; kk_3 = kk_3 + 0x10) {
      p0_4 = (float *)((long)A->data + (long)kk_2 * 4 + (long)(kk_3 * iVar1) * 4);
      for (kk_4 = 0; kk_4 < max_kk; kk_4 = kk_4 + 1) {
        *p0_3 = *p0_4;
        p0_3[1] = p0_4[iVar1];
        p0_3[2] = p0_4[iVar1 * 2];
        p0_3[3] = p0_4[iVar1 * 3];
        p0_3[4] = p0_4[iVar1 * 4];
        p0_3[5] = p0_4[iVar1 * 5];
        p0_3[6] = p0_4[iVar1 * 6];
        p0_3[7] = p0_4[iVar1 * 7];
        p0_3[8] = p0_4[iVar1 * 8];
        p0_3[9] = p0_4[iVar1 * 9];
        p0_3[10] = p0_4[iVar1 * 10];
        p0_3[0xb] = p0_4[iVar1 * 0xb];
        p0_3[0xc] = p0_4[iVar1 * 0xc];
        p0_3[0xd] = p0_4[iVar1 * 0xd];
        p0_3[0xe] = p0_4[iVar1 * 0xe];
        p0_3[0xf] = p0_4[iVar1 * 0xf];
        p0_4 = p0_4 + batch;
        p0_3 = p0_3 + 0x10;
      }
    }
    for (; kk_3 + 7 < max_ii; kk_3 = kk_3 + 8) {
      local_88 = (float *)((long)A->data + (long)kk_2 * 4 + (long)(kk_3 * iVar1) * 4);
      for (local_8c = 0; local_8c < max_kk; local_8c = local_8c + 1) {
        *p0_3 = *local_88;
        p0_3[1] = local_88[iVar1];
        p0_3[2] = local_88[iVar1 * 2];
        p0_3[3] = local_88[iVar1 * 3];
        p0_3[4] = local_88[iVar1 * 4];
        p0_3[5] = local_88[iVar1 * 5];
        p0_3[6] = local_88[iVar1 * 6];
        p0_3[7] = local_88[iVar1 * 7];
        local_88 = local_88 + batch;
        p0_3 = p0_3 + 8;
      }
    }
    for (; kk_3 + 3 < max_ii; kk_3 = kk_3 + 4) {
      local_98 = (float *)((long)A->data + (long)kk_2 * 4 + (long)(kk_3 * iVar1) * 4);
      for (local_9c = 0; local_9c < max_kk; local_9c = local_9c + 1) {
        *p0_3 = *local_98;
        p0_3[1] = local_98[iVar1];
        p0_3[2] = local_98[iVar1 * 2];
        p0_3[3] = local_98[iVar1 * 3];
        local_98 = local_98 + batch;
        p0_3 = p0_3 + 4;
      }
    }
    for (; kk_3 + 1 < max_ii; kk_3 = kk_3 + 2) {
      local_a8 = (float *)((long)A->data + (long)kk_2 * 4 + (long)(kk_3 * iVar1) * 4);
      for (local_ac = 0; local_ac < max_kk; local_ac = local_ac + 1) {
        *p0_3 = *local_a8;
        p0_3[1] = local_a8[iVar1];
        local_a8 = local_a8 + batch;
        p0_3 = p0_3 + 2;
      }
    }
    for (; kk_3 < max_ii; kk_3 = kk_3 + 1) {
      local_b8 = (float *)((long)A->data + (long)kk_2 * 4 + (long)(kk_3 * iVar1) * 4);
      for (local_bc = 0; local_bc < max_kk; local_bc = local_bc + 1) {
        *p0_3 = *local_b8;
        local_b8 = local_b8 + batch;
        p0_3 = p0_3 + 1;
      }
    }
  }
  return;
}

Assistant:

static void pack_A_tile(const Mat& A, Mat& AT, int batch, int max_ii, int max_kk)
{
    const int N = max_kk * batch;

    for (int b = 0; b < batch; b++)
    {
        float* pp = AT.row(b);

        int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; ii + 15 < max_ii; ii += 16)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                pp[4] = p0[4 * N];
                pp[5] = p0[5 * N];
                pp[6] = p0[6 * N];
                pp[7] = p0[7 * N];
                pp[8] = p0[8 * N];
                pp[9] = p0[9 * N];
                pp[10] = p0[10 * N];
                pp[11] = p0[11 * N];
                pp[12] = p0[12 * N];
                pp[13] = p0[13 * N];
                pp[14] = p0[14 * N];
                pp[15] = p0[15 * N];
                p0 += batch;
                pp += 16;
            }
        }
#endif // __AVX512F__
        for (; ii + 7 < max_ii; ii += 8)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                pp[4] = p0[4 * N];
                pp[5] = p0[5 * N];
                pp[6] = p0[6 * N];
                pp[7] = p0[7 * N];
                p0 += batch;
                pp += 8;
            }
        }
#endif // __AVX__
        for (; ii + 3 < max_ii; ii += 4)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                p0 += batch;
                pp += 4;
            }
        }
#endif // __SSE2__
        for (; ii + 1 < max_ii; ii += 2)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                p0 += batch;
                pp += 2;
            }
        }
        for (; ii < max_ii; ii++)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                p0 += batch;
                pp += 1;
            }
        }
    }
}